

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conv.cc
# Opt level: O3

void __thiscall
cnn::KMaxPooling::forward_impl
          (KMaxPooling *this,vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_> *xs,
          Tensor *fx)

{
  float fVar1;
  void *pvVar2;
  bool bVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined8 uVar6;
  byte bVar7;
  byte bVar8;
  float *pfVar9;
  ulong uVar10;
  uint uVar11;
  ulong uVar12;
  uint uVar13;
  ulong uVar14;
  long lVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  long lVar19;
  ushort uVar20;
  undefined1 auVar21 [32];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  int iVar28;
  Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_> x;
  Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_> y;
  float tmp [1024];
  Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_> local_1078;
  Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_> local_1058;
  float local_1038 [1026];
  
  Tensor::operator*(&local_1078,
                    *(xs->
                     super__Vector_base<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>).
                     _M_impl.super__Vector_impl_data._M_start);
  Tensor::operator*(&local_1058,fx);
  if (0x3ff < local_1078.
              super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
              .
              super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
              .m_cols.m_value) {
    __assert_fail("x.cols() < 1024",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/LeonCrashCode[P]LookAheadFeature/cnn/conv.cc"
                  ,0x122,
                  "virtual void cnn::KMaxPooling::forward_impl(const vector<const Tensor *> &, Tensor &) const"
                 );
  }
  uVar10 = (ulong)(uint)local_1078.
                        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                        .
                        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                        .m_rows.m_value;
  if (uVar10 == 0) {
    uVar11 = 0;
  }
  else {
    uVar18 = local_1078.
             super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
             .
             super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
             .m_cols.m_value & 0xffffffff;
    pvVar2 = (this->super_Node).aux_mem;
    lVar19 = 0;
    uVar11 = 0;
    uVar17 = 0;
    do {
      if (uVar18 != 0) {
        if (CONCAT44(local_1078.
                     super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                     .
                     super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                     .m_rows.m_value._4_4_,
                     (uint)local_1078.
                           super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                           .
                           super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                           .m_rows.m_value) <= (long)uVar17) goto LAB_002303fe;
        uVar12 = 0;
        pfVar9 = (float *)((long)local_1078.
                                 super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                                 .
                                 super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                                 .m_data + lVar19);
        do {
          if ((~(local_1078.
                 super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                 .
                 super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                 .m_cols.m_value >> 0x3f) &
              local_1078.
              super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
              .
              super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
              .m_cols.m_value) == uVar12) goto LAB_002303fe;
          fVar1 = *pfVar9;
          pfVar9 = pfVar9 + CONCAT44(local_1078.
                                     super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                                     .
                                     super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                                     .m_rows.m_value._4_4_,
                                     (uint)local_1078.
                                           super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                                           .
                                           super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                                           .m_rows.m_value);
          local_1038[uVar12] = -fVar1;
          uVar12 = uVar12 + 1;
        } while (uVar18 != uVar12);
      }
      uVar12 = (ulong)(this->k - 1);
      if (uVar18 != uVar12 && uVar18 != 0) {
        std::__introselect<float*,long,__gnu_cxx::__ops::_Iter_less_iter>
                  (local_1038,local_1038 + uVar12,local_1038 + uVar18,
                   (int)LZCOUNT(uVar18) * 2 ^ 0x7e);
        uVar12 = (ulong)(this->k - 1);
      }
      if (uVar18 != 0) {
        if (CONCAT44(local_1078.
                     super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                     .
                     super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                     .m_rows.m_value._4_4_,
                     (uint)local_1078.
                           super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                           .
                           super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                           .m_rows.m_value) <= (long)uVar17) {
LAB_002303fe:
          __assert_fail("row >= 0 && row < rows() && col >= 0 && col < cols()",
                        "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x16f,
                        "Scalar &Eigen::DenseCoeffsBase<Eigen::Map<Eigen::Matrix<float, -1, -1>>, 1>::operator()(Index, Index) [Derived = Eigen::Map<Eigen::Matrix<float, -1, -1>>, Level = 1]"
                       );
        }
        fVar1 = local_1038[uVar12];
        uVar12 = 0;
        uVar14 = 0;
        pfVar9 = (float *)((long)local_1078.
                                 super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                                 .
                                 super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                                 .m_data + lVar19);
        do {
          if (local_1078.
              super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
              .
              super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
              .m_cols.m_value <= (long)uVar12) goto LAB_002303fe;
          if (-fVar1 <= *pfVar9) {
            if ((local_1058.
                 super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                 .
                 super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                 .m_rows.m_value <= (long)uVar17) ||
               (local_1058.
                super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                .
                super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                .m_cols.m_value <= (long)uVar14)) goto LAB_002303fe;
            lVar15 = uVar14 * local_1058.
                              super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                              .
                              super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                              .m_rows.m_value;
            uVar13 = (int)uVar14 + 1;
            uVar14 = (ulong)uVar13;
            local_1058.
            super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
            .
            super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
            .m_data[uVar17 + lVar15] = *pfVar9;
            uVar16 = (ulong)uVar11;
            uVar11 = uVar11 + 1;
            *(int *)((long)pvVar2 + uVar16 * 4) = (int)uVar12;
            if (uVar13 == this->k) break;
          }
          uVar12 = uVar12 + 1;
          pfVar9 = pfVar9 + CONCAT44(local_1078.
                                     super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                                     .
                                     super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                                     .m_rows.m_value._4_4_,
                                     (uint)local_1078.
                                           super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                                           .
                                           super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                                           .m_rows.m_value);
        } while (uVar18 != uVar12);
      }
      uVar17 = uVar17 + 1;
      lVar19 = lVar19 + 4;
    } while (uVar17 != uVar10);
  }
  uVar10 = (ulong)(this->super_Node).dim.nd;
  if (uVar10 == 0) {
    iVar28 = 1;
  }
  else {
    auVar22 = vpbroadcastd_avx512f(ZEXT416(1));
    auVar23 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar24 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    auVar25 = vpbroadcastq_avx512f();
    uVar17 = 0;
    do {
      auVar26 = vpbroadcastq_avx512f();
      auVar27 = vmovdqa64_avx512f(auVar22);
      auVar22 = vporq_avx512f(auVar26,auVar23);
      auVar26 = vporq_avx512f(auVar26,auVar24);
      uVar6 = vpcmpuq_avx512f(auVar26,auVar25,2);
      bVar7 = (byte)uVar6;
      uVar6 = vpcmpuq_avx512f(auVar22,auVar25,2);
      bVar8 = (byte)uVar6;
      uVar20 = CONCAT11(bVar8,bVar7);
      auVar22 = vmovdqu32_avx512f(*(undefined1 (*) [64])((this->super_Node).dim.d + uVar17));
      auVar26._4_4_ = (uint)((byte)(uVar20 >> 1) & 1) * auVar22._4_4_;
      auVar26._0_4_ = (uint)(bVar7 & 1) * auVar22._0_4_;
      auVar26._8_4_ = (uint)((byte)(uVar20 >> 2) & 1) * auVar22._8_4_;
      auVar26._12_4_ = (uint)((byte)(uVar20 >> 3) & 1) * auVar22._12_4_;
      auVar26._16_4_ = (uint)((byte)(uVar20 >> 4) & 1) * auVar22._16_4_;
      auVar26._20_4_ = (uint)((byte)(uVar20 >> 5) & 1) * auVar22._20_4_;
      auVar26._24_4_ = (uint)((byte)(uVar20 >> 6) & 1) * auVar22._24_4_;
      auVar26._28_4_ = (uint)((byte)(uVar20 >> 7) & 1) * auVar22._28_4_;
      auVar26._32_4_ = (uint)(bVar8 & 1) * auVar22._32_4_;
      auVar26._36_4_ = (uint)(bVar8 >> 1 & 1) * auVar22._36_4_;
      auVar26._40_4_ = (uint)(bVar8 >> 2 & 1) * auVar22._40_4_;
      auVar26._44_4_ = (uint)(bVar8 >> 3 & 1) * auVar22._44_4_;
      auVar26._48_4_ = (uint)(bVar8 >> 4 & 1) * auVar22._48_4_;
      auVar26._52_4_ = (uint)(bVar8 >> 5 & 1) * auVar22._52_4_;
      auVar26._56_4_ = (uint)(bVar8 >> 6 & 1) * auVar22._56_4_;
      auVar26._60_4_ = (uint)(bVar8 >> 7) * auVar22._60_4_;
      uVar17 = uVar17 + 0x10;
      auVar22 = vpmulld_avx512f(auVar26,auVar27);
    } while ((uVar10 + 0xf & 0xfffffffffffffff0) != uVar17);
    auVar22 = vmovdqa32_avx512f(auVar22);
    auVar23._0_4_ = (uint)(bVar7 & 1) * auVar22._0_4_ | (uint)!(bool)(bVar7 & 1) * auVar27._0_4_;
    bVar3 = (bool)((byte)(uVar20 >> 1) & 1);
    auVar23._4_4_ = (uint)bVar3 * auVar22._4_4_ | (uint)!bVar3 * auVar27._4_4_;
    bVar3 = (bool)((byte)(uVar20 >> 2) & 1);
    auVar23._8_4_ = (uint)bVar3 * auVar22._8_4_ | (uint)!bVar3 * auVar27._8_4_;
    bVar3 = (bool)((byte)(uVar20 >> 3) & 1);
    auVar23._12_4_ = (uint)bVar3 * auVar22._12_4_ | (uint)!bVar3 * auVar27._12_4_;
    bVar3 = (bool)((byte)(uVar20 >> 4) & 1);
    auVar23._16_4_ = (uint)bVar3 * auVar22._16_4_ | (uint)!bVar3 * auVar27._16_4_;
    bVar3 = (bool)((byte)(uVar20 >> 5) & 1);
    auVar23._20_4_ = (uint)bVar3 * auVar22._20_4_ | (uint)!bVar3 * auVar27._20_4_;
    bVar3 = (bool)((byte)(uVar20 >> 6) & 1);
    auVar23._24_4_ = (uint)bVar3 * auVar22._24_4_ | (uint)!bVar3 * auVar27._24_4_;
    bVar3 = (bool)((byte)(uVar20 >> 7) & 1);
    auVar23._28_4_ = (uint)bVar3 * auVar22._28_4_ | (uint)!bVar3 * auVar27._28_4_;
    auVar23._32_4_ = (uint)(bVar8 & 1) * auVar22._32_4_ | (uint)!(bool)(bVar8 & 1) * auVar27._32_4_;
    bVar3 = (bool)(bVar8 >> 1 & 1);
    auVar23._36_4_ = (uint)bVar3 * auVar22._36_4_ | (uint)!bVar3 * auVar27._36_4_;
    bVar3 = (bool)(bVar8 >> 2 & 1);
    auVar23._40_4_ = (uint)bVar3 * auVar22._40_4_ | (uint)!bVar3 * auVar27._40_4_;
    bVar3 = (bool)(bVar8 >> 3 & 1);
    auVar23._44_4_ = (uint)bVar3 * auVar22._44_4_ | (uint)!bVar3 * auVar27._44_4_;
    bVar3 = (bool)(bVar8 >> 4 & 1);
    auVar23._48_4_ = (uint)bVar3 * auVar22._48_4_ | (uint)!bVar3 * auVar27._48_4_;
    bVar3 = (bool)(bVar8 >> 5 & 1);
    auVar23._52_4_ = (uint)bVar3 * auVar22._52_4_ | (uint)!bVar3 * auVar27._52_4_;
    bVar3 = (bool)(bVar8 >> 6 & 1);
    auVar23._56_4_ = (uint)bVar3 * auVar22._56_4_ | (uint)!bVar3 * auVar27._56_4_;
    auVar23._60_4_ =
         (uint)(bVar8 >> 7) * auVar22._60_4_ | (uint)!(bool)(bVar8 >> 7) * auVar27._60_4_;
    auVar21 = vextracti64x4_avx512f(auVar23,1);
    auVar22 = vpmulld_avx512f(auVar23,ZEXT3264(auVar21));
    auVar4 = vpmulld_avx(auVar22._0_16_,auVar22._16_16_);
    auVar5 = vpshufd_avx(auVar4,0xee);
    auVar4 = vpmulld_avx(auVar4,auVar5);
    auVar5 = vpshufd_avx(auVar4,0x55);
    auVar4 = vpmulld_avx(auVar4,auVar5);
    iVar28 = auVar4._0_4_;
  }
  if (uVar11 == iVar28 * (this->super_Node).dim.bd) {
    return;
  }
  __assert_fail("mi == dim.size()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/LeonCrashCode[P]LookAheadFeature/cnn/conv.cc"
                ,0x13b,
                "virtual void cnn::KMaxPooling::forward_impl(const vector<const Tensor *> &, Tensor &) const"
               );
}

Assistant:

void KMaxPooling::forward_impl(const vector<const Tensor*>& xs, Tensor& fx) const {
#ifdef HAVE_CUDA
  throw std::runtime_error("KMaxPooling::forward not implemented for CUDA");
#else
  auto x=**xs[0];
  auto y=*fx;
  float tmp[1024];
  assert(x.cols() < 1024);
  unsigned mi = 0;
  const unsigned rows = x.rows();
  const unsigned xcols = x.cols();
  int* maxmap = static_cast<int*>(aux_mem);
  for (unsigned i=0; i < rows; ++i) {
    //cerr << "row(" << i << ")=" << x.row(i) << endl;
    for (unsigned j=0; j < xcols; ++j)
      tmp[j] = -x(i,j);
    nth_element(tmp, tmp + (k-1), tmp + xcols);
    const float c = -tmp[k-1];  // kth largest element in row i
    unsigned tt = 0;
    for (unsigned j = 0; j < xcols; ++j) {
      const float xij = x(i,j);
      if (xij >= c) {
        //cerr << xij << ' ';
        y(i,tt) = xij;
        //assert(mi < dim.size());
        maxmap[mi++] = j;
        ++tt;
        if (tt == k) break;  // could happen in case of ties
      }
    }
    //cerr << endl; abort();
  }
  assert(mi == dim.size());
#endif
}